

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void msub_stride(double *A,double *B,double *C,int rows,int cols,int sA,int sB,int sC)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar3 = uVar4;
  }
  uVar1 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar1 = uVar4;
  }
  for (; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      C[uVar2] = A[uVar2] - B[uVar2];
    }
    C = C + sC;
    B = B + sB;
    A = A + sA;
  }
  return;
}

Assistant:

void msub_stride(double* A, double* B, double* C,int rows,int cols,int sA,int sB,int sC) {
	int i,j,u,v,w;
	 
	for (i = 0; i < rows; ++i) {
		u = i * sC;
		v = i * sA;
		w = i * sB;
		for(j = 0; j < cols;j++) {
			C[j + u] = A[j + v] - B[j + w];
		}
	}
}